

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O0

void __thiscall TimeTest_Format_Test::TestBody(TimeTest_Format_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  tm tm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  char *actual_expression;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  tm *in_stack_ffffffffffffff80;
  char (*in_stack_ffffffffffffff88) [25];
  AssertionResult local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  Message *message;
  AssertHelper *this_01;
  
  this_01 = (AssertHelper *)0x0;
  local_48 = 0;
  message = (Message *)0x7400000003;
  uStack_40 = 0x1900000000;
  actual_expression = &stack0xffffffffffffff88;
  fmt::v5::format<char[25],tm>(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),actual_expression
             ,(char (*) [24])CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10ac21)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,actual_expression);
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10ac6f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10acaf);
  return;
}

Assistant:

TEST(TimeTest, Format) {
  std::tm tm = std::tm();
  tm.tm_year = 116;
  tm.tm_mon  = 3;
  tm.tm_mday = 25;
  EXPECT_EQ("The date is 2016-04-25.",
            fmt::format("The date is {:%Y-%m-%d}.", tm));
}